

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O2

string_type * __thiscall
booster::locale::impl_posix::collator<char>::do_transform_abi_cxx11_
          (string_type *__return_storage_ptr__,collator<char> *this,char_type *b,char_type *e)

{
  size_t __new_size;
  vector<char,_std::allocator<char>_> buf;
  string_type s;
  allocator_type local_51;
  _Vector_base<char,_std::allocator<char>_> local_50;
  char *local_38 [2];
  char local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,b,e);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_50,((long)e - (long)b) * 2 + 1,&local_51)
  ;
  __new_size = strxfrm_l(local_50._M_impl.super__Vector_impl_data._M_start,local_38[0],
                         (long)local_50._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_50._M_impl.super__Vector_impl_data._M_start,
                         (__locale_t)
                         *(this->lc_).
                          super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((ulong)((long)local_50._M_impl.super__Vector_impl_data._M_finish -
             (long)local_50._M_impl.super__Vector_impl_data._M_start) < __new_size) {
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)&local_50,__new_size);
    strxfrm_l(local_50._M_impl.super__Vector_impl_data._M_start,local_38[0],__new_size,
              (__locale_t)
              *(this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_50._M_impl.super__Vector_impl_data._M_start,
             local_50._M_impl.super__Vector_impl_data._M_start + __new_size);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_50);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

virtual string_type do_transform(char_type const *b,char_type const *e) const
    {
        string_type s(b,e-b);
        std::vector<char_type> buf((e-b)*2+1);
        size_t n = coll_traits<char_type>::xfrm(&buf.front(),s.c_str(),buf.size(),*lc_);
        if(n>buf.size()) {
            buf.resize(n);
            coll_traits<char_type>::xfrm(&buf.front(),s.c_str(),n,*lc_);
        }
        return string_type(&buf.front(),n);
    }